

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedAssertion.cpp
# Opt level: O2

VisitResult * __thiscall
slang::analysis::ClockVisitor::visit
          (VisitResult *__return_storage_ptr__,ClockVisitor *this,CaseAssertionExpr *expr,
          Clock outerClock,bitmask<slang::analysis::VisitFlags> flags)

{
  CaseAssertionExpr *expr_00;
  VisitResult *pVVar1;
  ItemGroup *item;
  pointer pIVar2;
  AssertionExpr *pAVar3;
  long lVar4;
  bitmask<slang::analysis::VisitFlags> local_bc;
  Clock local_b8;
  CaseAssertionExpr *local_b0;
  VisitResult *local_a8;
  VisitResult local_a0;
  VisitResult local_68;
  
  pIVar2 = (expr->items)._M_ptr;
  local_bc.m_bits = flags.m_bits;
  local_b8 = outerClock;
  local_b0 = expr;
  local_a8 = __return_storage_ptr__;
  for (lVar4 = (expr->items)._M_extent._M_extent_value * 0x18; expr_00 = local_b0, lVar4 != 0;
      lVar4 = lVar4 + -0x18) {
    pAVar3 = (pIVar2->body).ptr;
    ast::AssertionExpr::
    visit<slang::analysis::ClockVisitor,slang::ast::TimingControl_const*&,slang::bitmask<slang::analysis::VisitFlags>&>
              (&local_68,pAVar3,this,&local_b8,&local_bc);
    SmallVectorBase<const_slang::ast::TimingControl_*>::cleanup
              ((SmallVectorBase<const_slang::ast::TimingControl_*> *)&local_68,
               (EVP_PKEY_CTX *)pAVar3);
    pIVar2 = pIVar2 + 1;
  }
  pAVar3 = local_b0->defaultCase;
  if (pAVar3 != (AssertionExpr *)0x0) {
    ast::AssertionExpr::
    visit<slang::analysis::ClockVisitor,slang::ast::TimingControl_const*&,slang::bitmask<slang::analysis::VisitFlags>&>
              (&local_a0,pAVar3,this,&local_b8,&local_bc);
    SmallVectorBase<const_slang::ast::TimingControl_*>::cleanup
              ((SmallVectorBase<const_slang::ast::TimingControl_*> *)&local_a0,
               (EVP_PKEY_CTX *)pAVar3);
  }
  pVVar1 = local_a8;
  inheritedClock(local_a8,this,&expr_00->super_AssertionExpr,local_b8,local_bc);
  return pVVar1;
}

Assistant:

VisitResult visit(const CaseAssertionExpr& expr, Clock outerClock, bitmask<VF> flags) {
        for (auto& item : expr.items)
            item.body->visit(*this, outerClock, flags);

        if (expr.defaultCase)
            expr.defaultCase->visit(*this, outerClock, flags);

        // Semantic leading clock is always inherited.
        return inheritedClock(expr, outerClock, flags);
    }